

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_split.cc
# Opt level: O0

string_view __thiscall absl::ByLength::Find(ByLength *this,string_view text,size_t pos)

{
  size_type sVar1;
  unsigned_long *puVar2;
  const_pointer pvVar3;
  ulong *in_RDI;
  string_view substr;
  char *local_48;
  char *__n;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  string_view local_10;
  
  __n = local_48;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_20);
  puVar2 = std::min<unsigned_long>
                     ((unsigned_long *)&stack0xffffffffffffffd0,
                      (unsigned_long *)&stack0xffffffffffffffc8);
  _local_48 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        ((basic_string_view<char,_std::char_traits<char>_> *)*puVar2,sVar1,
                         (size_type)__n);
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::length
                    ((basic_string_view<char,_std::char_traits<char>_> *)&local_48);
  if (*in_RDI < sVar1) {
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&local_48);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_10,pvVar3 + *in_RDI,0);
  }
  else {
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_20);
    sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_20);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_10,pvVar3 + sVar1,0);
  }
  return local_10;
}

Assistant:

absl::string_view ByLength::Find(absl::string_view text, size_t pos) const {
  pos = std::min(pos, text.size());  // truncate `pos`
  absl::string_view substr = text.substr(pos);
  // If the string is shorter than the chunk size we say we
  // "can't find the delimiter" so this will be the last chunk.
  if (substr.length() <= static_cast<size_t>(length_))
    return absl::string_view(text.data() + text.size(), 0);

  return absl::string_view(substr.data() + length_, 0);
}